

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_winzip_aes_decode.c
# Opt level: O2

zip_int64_t
winzip_aes_decrypt(zip_source_t *src,void *ud,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  zip_uint8_t *password;
  _Bool _Var1;
  int iVar2;
  zip_uint64_t zVar3;
  size_t password_length;
  zip_winzip_aes_t *ctx;
  zip_int64_t zVar4;
  zip_uint64_t zVar5;
  long lVar6;
  ulong uVar7;
  zip_stat_t *st;
  short local_42 [5];
  zip_uint8_t header [18];
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    zVar5 = 10;
    if (*(short *)((long)ud + 8) != 0x101) {
      zVar5 = (ulong)(*(short *)((long)ud + 8) != 0x102) * 4 + 0xe;
    }
    zVar3 = zip_source_read(src,header,zVar5);
    if ((long)zVar3 < 0) goto LAB_00110082;
    if (zVar3 == zVar5) {
      password = *ud;
      password_length = strlen((char *)password);
      ctx = _zip_winzip_aes_new(password,password_length,header,*(zip_uint16_t *)((long)ud + 8),
                                (zip_uint8_t *)local_42,(zip_error_t *)((long)ud + 0x28));
      *(zip_winzip_aes_t **)((long)ud + 0x20) = ctx;
      if (ctx == (zip_winzip_aes_t *)0x0) {
        return -1;
      }
      lVar6 = 8;
      if (*(short *)((long)ud + 8) != 0x101) {
        lVar6 = (ulong)(*(short *)((long)ud + 8) != 0x102) * 4 + 0xc;
      }
      if (local_42[0] == *(short *)(header + lVar6)) {
        *(undefined8 *)((long)ud + 0x18) = 0;
        return 0;
      }
      _zip_winzip_aes_free(ctx);
      *(undefined8 *)((long)ud + 0x20) = 0;
      iVar2 = 0x1b;
    }
    else {
      iVar2 = 0x11;
    }
    break;
  case ZIP_SOURCE_READ:
    uVar7 = *(long *)((long)ud + 0x10) - *(long *)((long)ud + 0x18);
    if (len <= uVar7) {
      uVar7 = len;
    }
    if (uVar7 == 0) {
      zVar4 = zip_source_read(src,local_42,10);
      if (zVar4 < 10) goto LAB_00110082;
      _Var1 = _zip_winzip_aes_finish(*(zip_winzip_aes_t **)((long)ud + 0x20),header);
      if (_Var1) {
        _zip_winzip_aes_free(*(zip_winzip_aes_t **)((long)ud + 0x20));
        *(undefined8 *)((long)ud + 0x20) = 0;
        iVar2 = bcmp(local_42,header,10);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = 7;
        break;
      }
    }
    else {
      zVar5 = zip_source_read(src,data,uVar7);
      if ((long)zVar5 < 0) {
LAB_00110082:
        _zip_error_set_from_source((zip_error_t *)((long)ud + 0x28),src);
        return -1;
      }
      *(long *)((long)ud + 0x18) = *(long *)((long)ud + 0x18) + zVar5;
      _Var1 = _zip_winzip_aes_decrypt
                        (*(zip_winzip_aes_t **)((long)ud + 0x20),(zip_uint8_t *)data,zVar5);
      if (_Var1) {
        return zVar5;
      }
    }
    iVar2 = 0x14;
    break;
  case ZIP_SOURCE_CLOSE:
    return 0;
  case ZIP_SOURCE_STAT:
    *(undefined2 *)((long)data + 0x36) = 0;
    uVar7 = *data;
    *(ulong *)data = uVar7 | 0x80;
    if ((uVar7 & 8) != 0) {
      lVar6 = -0x14;
      if (*(short *)((long)ud + 8) != 0x101) {
        lVar6 = (ulong)(*(short *)((long)ud + 8) == 0x102) * 4 + -0x1c;
      }
      *(long *)((long)data + 0x20) = *(long *)((long)data + 0x20) + lVar6;
      return 0;
    }
    return 0;
  case ZIP_SOURCE_ERROR:
    zVar4 = zip_error_to_data((zip_error_t *)((long)ud + 0x28),data,len);
    return zVar4;
  case ZIP_SOURCE_FREE:
    winzip_aes_free((winzip_aes *)ud);
    return 0;
  default:
    iVar2 = 0x12;
    break;
  case ZIP_SOURCE_SUPPORTS:
    zVar4 = zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,3,4,5,0xffffffff);
    return zVar4;
  }
  zip_error_set((zip_error_t *)((long)ud + 0x28),iVar2,0);
  return -1;
}

Assistant:

static zip_int64_t
winzip_aes_decrypt(zip_source_t *src, void *ud, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct winzip_aes *ctx;
    zip_int64_t n;

    ctx = (struct winzip_aes *)ud;

    switch (cmd) {
    case ZIP_SOURCE_OPEN:
	if (decrypt_header(src, ctx) < 0) {
	    return -1;
	}
	ctx->current_position = 0;
	return 0;

    case ZIP_SOURCE_READ:
	if (len > ctx->data_length - ctx->current_position) {
	    len = ctx->data_length - ctx->current_position;
	}

	if (len == 0) {
	    if (!verify_hmac(src, ctx)) {
		return -1;
	    }
	    return 0;
	}

	if ((n = zip_source_read(src, data, len)) < 0) {
	    _zip_error_set_from_source(&ctx->error, src);
	    return -1;
	}
	ctx->current_position += (zip_uint64_t)n;

	if (!_zip_winzip_aes_decrypt(ctx->aes_ctx, (zip_uint8_t *)data, (zip_uint64_t)n)) {
	    zip_error_set(&ctx->error, ZIP_ER_INTERNAL, 0);
	    return -1;
	}

	return n;

    case ZIP_SOURCE_CLOSE:
	return 0;

    case ZIP_SOURCE_STAT: {
	zip_stat_t *st;

	st = (zip_stat_t *)data;

	st->encryption_method = ZIP_EM_NONE;
	st->valid |= ZIP_STAT_ENCRYPTION_METHOD;
	if (st->valid & ZIP_STAT_COMP_SIZE) {
	    st->comp_size -= 12 + SALT_LENGTH(ctx->encryption_method);
	}

	return 0;
    }

    case ZIP_SOURCE_SUPPORTS:
	return zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, -1);

    case ZIP_SOURCE_ERROR:
	return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
	winzip_aes_free(ctx);
	return 0;

    default:
	zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	return -1;
    }
}